

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListF
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  uint key2;
  QName *pQVar1;
  XMLCh *key1;
  XMLSize_t XVar2;
  GrammarResolver *this_00;
  bool bVar3;
  int iVar4;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *this_01;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *this_02;
  SchemaElementDecl **ppSVar5;
  undefined4 extraout_var;
  Grammar *pGVar6;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  XMLSize_t i;
  XMLSize_t getAt;
  SchemaElementDecl *chainElem;
  DOMElement *local_40;
  MemoryManager *local_38;
  
  pQVar1 = (elemDecl->super_XMLElementDecl).fElementName;
  local_40 = elem;
  this_01 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
            ::get(this->fValidSubstitutionGroups,pQVar1->fLocalPart,pQVar1->fURIId);
  if (this_01 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
    return;
  }
  pQVar1 = (subsElemDecl->super_XMLElementDecl).fElementName;
  key2 = pQVar1->fURIId;
  key1 = pQVar1->fLocalPart;
  this_02 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
            ::get(this->fValidSubstitutionGroups,key1,key2);
  if (this_02 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
    if (this->fTargetNSURI == key2) {
      return;
    }
    this_00 = this->fGrammarResolver;
    iVar4 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                      (this->fURIStringPool,(ulong)key2);
    pGVar6 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar4));
    if (pGVar6 == (Grammar *)0x0) {
      return;
    }
    toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                    *)pGVar6[10].super_XSerializable._vptr_XSerializable,key1,key2);
    if (toCopy == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      return;
    }
    local_38 = this->fGrammarPoolMemoryManager;
    this_02 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
              XMemory::operator_new(0x28,local_38);
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(this_02,toCopy);
    RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::put(this->fValidSubstitutionGroups,key1,key2,this_02);
  }
  XVar2 = this_01->fCurCount;
  for (getAt = 0; XVar2 != getAt; getAt = getAt + 1) {
    ppSVar5 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt(this_01,getAt);
    chainElem = *ppSVar5;
    bVar3 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement(this_02,&chainElem,0);
    if ((!bVar3) &&
       (bVar3 = isSubstitutionGroupValid
                          (this,local_40,subsElemDecl,chainElem->fComplexTypeInfo,
                           chainElem->fDatatypeValidator,(XMLCh *)0x0,false), bVar3)) {
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(this_02,&chainElem);
      buildValidSubstitutionListB(this,local_40,chainElem,subsElemDecl);
    }
  }
  return;
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListF(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    int elemURI = elemDecl->getURI();
    XMLCh* elemName = elemDecl->getBaseName();
    ValueVectorOf<SchemaElementDecl*>* validSubsElements =fValidSubstitutionGroups->get(elemName, elemURI);

    if (validSubsElements) {

        int subsElemURI = subsElemDecl->getURI();
        XMLCh* subsElemName = subsElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubs = fValidSubstitutionGroups->get(subsElemName, subsElemURI);

        if (!validSubs) {

            if (fTargetNSURI == subsElemURI) {
                return; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

            if (!aGrammar)
                return;

            validSubs = aGrammar->getValidSubstitutionGroups()->get(subsElemName, subsElemURI);

            if (!validSubs) {
                return;
            }

            validSubs = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubs);
            fValidSubstitutionGroups->put((void*) subsElemName, subsElemURI, validSubs);
        }

        XMLSize_t elemSize = validSubsElements->size();
        for (XMLSize_t i=0; i<elemSize; i++) {

            SchemaElementDecl* chainElem = validSubsElements->elementAt(i);

            if (validSubs->containsElement(chainElem)) {
                continue;
            }

            if (isSubstitutionGroupValid(elem, subsElemDecl, chainElem->getComplexTypeInfo(),
                                         chainElem->getDatatypeValidator(), 0, false)) {
                validSubs->addElement(chainElem);
                buildValidSubstitutionListB(elem, chainElem, subsElemDecl);
            }
        }
    }
}